

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O1

array<int,_3UL> __thiscall PFData::unflattenIndex(PFData *this,int index)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  array<int,_3UL> aVar6;
  
  uVar2 = 0xffffffffffffffff;
  iVar3 = -1;
  if (-1 < index) {
    iVar1 = this->m_nx;
    iVar5 = this->m_ny * iVar1;
    if (index < this->m_nz * iVar5) {
      iVar4 = index - iVar5 * (int)((long)index / (long)iVar5);
      iVar3 = iVar4 % iVar1;
      uVar2 = (long)index / (long)iVar5 & 0xffffffffU | (long)iVar4 / (long)iVar1 << 0x20;
    }
  }
  aVar6._M_elems[2] = iVar3;
  aVar6._M_elems[0] = (int)uVar2;
  aVar6._M_elems[1] = (int)(uVar2 >> 0x20);
  return (array<int,_3UL>)aVar6._M_elems;
}

Assistant:

std::array<int, 3> PFData::unflattenIndex(int index) const{
    if(index >= getNZ() * getNY() * getNX() || index < 0){  //Invalid index, @@TODO assert instead?
        return {-1, -1, -1};
    }

    const int z = index / (getNX() * getNY());
    index -= z * getNX() * getNY();

    const int y = index / getNX();
    index -= y * getNX();

    const int x = index;    //index remainder is x value

    //Sanity check
    assert(z < getNZ() && z >= 0);
    assert(y < getNY() && y >= 0);
    assert(x < getNX() && x >= 0);

    return {z, y, x};
}